

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_pseudorandom_time_point_seed.h
# Opt level: O3

uint util::util_pseudorandom_time_point_seed::value<unsigned_int>(void)

{
  uint *puVar1;
  size_t data_index;
  long lVar2;
  char cVar3;
  ulong uVar4;
  string str_tm;
  stringstream strm;
  byte local_1c8 [16];
  long *local_1b8;
  size_t local_1b0;
  long local_1a8 [2];
  undefined8 local_198;
  undefined8 uStack_190;
  long local_188 [2];
  undefined8 uStack_178;
  uint auStack_170 [22];
  ios_base local_118 [112];
  char acStack_a8 [152];
  
  local_198 = 0;
  uStack_190 = 0;
  timespec_get(&local_198,1);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_198);
  local_1c8[0] = 0;
  local_1c8[1] = 0;
  local_1c8[2] = 0;
  local_1c8[3] = 0;
  local_1c8[4] = 0;
  local_1c8[5] = 0;
  local_1c8[6] = 0;
  local_1c8[7] = 0;
  local_1c8[8] = 0;
  local_1c8[9] = 0;
  local_1c8[10] = 0;
  local_1c8[0xb] = 0;
  local_1c8[0xc] = 0;
  local_1c8[0xd] = 0;
  local_1c8[0xe] = 0;
  local_1c8[0xf] = 0;
  *(undefined8 *)((long)&uStack_178 + *(long *)(local_188[0] + -0x18)) = 0x10;
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  lVar2 = *(long *)(local_188[0] + -0x18);
  if (acStack_a8[lVar2 + 1] == '\0') {
    std::ios::widen((char)local_1c8 + (char)lVar2 + '@');
    acStack_a8[lVar2 + 1] = '\x01';
  }
  acStack_a8[lVar2] = '0';
  std::ostream::_M_insert<unsigned_long>((ulong)local_188);
  std::__cxx11::stringbuf::str();
  if (0 < (long)local_1b0) {
    memcpy(local_1c8,local_1b8,local_1b0);
  }
  uVar4 = 0;
  lVar2 = 0;
  do {
    uVar4 = uVar4 ^ (ulong)local_1c8[lVar2] << 0x38;
    cVar3 = '\b';
    do {
      uVar4 = (long)uVar4 >> 0x3f & 0x42f0e1eba9ea3693U ^ uVar4 * 2;
      cVar3 = cVar3 + -1;
    } while (cVar3 != '\0');
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_198);
  std::ios_base::~ios_base(local_118);
  return (uint)uVar4;
}

Assistant:

static auto now() -> std::uint64_t
    {
      #if defined(__CYGWIN__)

      return static_cast<std::uint64_t>(std::clock());

      #else

      // Get the time (t_now).
      timespec ts { };

      timespec_get(&ts, TIME_UTC);

      return
        static_cast<std::uint64_t>
        (
            static_cast<std::uint64_t>(static_cast<std::uint64_t>(ts.tv_sec) * UINT64_C(1000000000))
          + static_cast<std::uint64_t>(ts.tv_nsec)
        );

      #endif
    }